

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

bool check_shield_block(CHAR_DATA *ch,CHAR_DATA *victim,int dt)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  OBJ_DATA *pOVar4;
  float *pfVar5;
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var6;
  char *attack;
  char buf2 [4608];
  char buf1 [4608];
  float chance;
  int cd_sk;
  undefined4 in_stack_ffffffffffffdba8;
  int in_stack_ffffffffffffdbac;
  CHAR_DATA *in_stack_ffffffffffffdbb0;
  ulong uVar7;
  CHAR_DATA *ch_00;
  CHAR_DATA *ch_01;
  float local_2434;
  char *local_2430;
  char local_2428 [172];
  int in_stack_ffffffffffffdc84;
  undefined1 in_stack_ffffffffffffdc8b;
  int in_stack_ffffffffffffdc8c;
  CHAR_DATA *in_stack_ffffffffffffdc90;
  int in_stack_ffffffffffffdcac;
  CHAR_DATA *in_stack_ffffffffffffdcb0;
  char local_1228 [4612];
  float local_24;
  int local_20;
  CHAR_DATA *local_18;
  CHAR_DATA *local_10;
  bool local_1;
  
  local_20 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  pOVar4 = get_eq_char(in_RSI,0xb);
  if (pOVar4 == (OBJ_DATA *)0x0) {
    local_1 = false;
  }
  else {
    bVar1 = is_awake(local_18);
    if (bVar1) {
      iVar3 = get_skill(in_stack_ffffffffffffdcb0,in_stack_ffffffffffffdcac);
      if ((float)iVar3 < 2.0) {
        local_1 = false;
      }
      else {
        local_24 = (float)iVar3 / 4.0 + 15.0;
        local_20 = get_skill(in_stack_ffffffffffffdcb0,in_stack_ffffffffffffdcac);
        if (1 < local_20) {
          iVar3 = number_percent();
          if ((double)local_20 * 0.85 <= (double)iVar3) {
            check_improve(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,
                          (bool)in_stack_ffffffffffffdc8b,in_stack_ffffffffffffdc84);
          }
          else {
            local_24 = local_24 + 25.0;
            check_improve(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,
                          (bool)in_stack_ffffffffffffdc8b,in_stack_ffffffffffffdc84);
          }
        }
        bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbac,in_stack_ffffffffffffdba8));
        if (((!bVar1) && (iVar3 = check_posture(local_10), iVar3 == -1)) &&
           (bVar1 = style_check((int)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdbac), bVar1)) {
          local_24 = local_24 + 20.0;
        }
        bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbac,in_stack_ffffffffffffdba8));
        if (!bVar1) {
          iVar3 = check_posture(local_18);
          if ((iVar3 == -1) &&
             (bVar1 = style_check((int)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdbac), bVar1))
          {
            local_24 = local_24 + 10.0;
          }
          iVar3 = check_posture(local_18);
          if ((iVar3 == 1) &&
             (bVar1 = style_check((int)in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdbac), bVar1))
          {
            local_24 = local_24 - 20.0;
          }
        }
        bVar1 = is_evil((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbac,in_stack_ffffffffffffdba8));
        if (((bVar1) && (local_18->level < local_10->level)) &&
           (bVar1 = is_affected(local_10,(int)gsn_awe), bVar1)) {
          local_24 = local_24 - 20.0;
        }
        bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbac,in_stack_ffffffffffffdba8));
        if ((bVar1) ||
           (bVar1 = is_npc((CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffdbac,in_stack_ffffffffffffdba8)), bVar1)) {
          local_24 = (float)((int)local_18->level - (int)local_10->level) + local_24;
        }
        sVar2 = get_hitroll((CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffdbac,in_stack_ffffffffffffdba8));
        local_24 = (((float)(int)local_10->balance +
                    ((1.0 - (float)(int)sVar2 / 250.0) * local_24 - (float)(int)local_18->balance))
                   - (float)(int)local_10->batter) - (float)local_10->analyze;
        if (local_18->analyzePC == local_10) {
          local_24 = (float)local_18->analyze + local_24;
        }
        bVar1 = check_entwine(local_18,1);
        if (bVar1) {
          local_24 = local_24 / 2.0;
        }
        local_2434 = 55.0;
        pfVar5 = std::min<float>(&local_2434,&local_24);
        local_24 = *pfVar5;
        iVar3 = number_percent();
        if ((float)iVar3 < local_24) {
          local_2430 = get_dam_message(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdbac);
          sprintf(local_1228,"You block $n\'s %s with your shield.",local_2430);
          sprintf(local_2428,"$N blocks your %s with $S shield.",local_2430);
          ch_01 = (CHAR_DATA *)local_18->wiznet[0];
          _Var6 = std::pow<int,int>(0,0x5de4e7);
          if (((ulong)ch_01 & (long)_Var6) != 0) {
            sprintf(local_1228,"You block $n\'s %s with your shield. (%d%%)",local_2430,
                    (ulong)(uint)(int)local_24);
          }
          ch_00 = (CHAR_DATA *)local_10->wiznet[0];
          _Var6 = std::pow<int,int>(0,0x5de541);
          if (((ulong)ch_00 & (long)_Var6) != 0) {
            sprintf(local_2428,"$N blocks your %s with $S shield. (%d%%)",local_2430,
                    (ulong)(uint)(int)local_24);
          }
          act((char *)ch_01,ch_00,in_stack_ffffffffffffdbb0,
              (void *)CONCAT44(in_stack_ffffffffffffdbac,in_stack_ffffffffffffdba8),0);
          act((char *)ch_01,ch_00,in_stack_ffffffffffffdbb0,
              (void *)CONCAT44(in_stack_ffffffffffffdbac,in_stack_ffffffffffffdba8),0);
          iVar3 = (int)in_stack_ffffffffffffdbb0;
          check_improve(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,
                        (bool)in_stack_ffffffffffffdc8b,in_stack_ffffffffffffdc84);
          bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbac,in_stack_ffffffffffffdba8))
          ;
          if (bVar1) {
            uVar7 = local_10->progtypes[0];
            _Var6 = std::pow<int,int>(0,0x5de64f);
            if (((uVar7 & (long)_Var6) != 0) &&
               (bVar1 = str_cmp(local_10->pIndexData->mprogs->fight_name,"fight_prog_barbarian"),
               !bVar1)) {
              check_batter(ch_01);
            }
          }
          else {
            bVar1 = style_check(iVar3,in_stack_ffffffffffffdbac);
            if (bVar1) {
              check_batter(ch_01);
            }
          }
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool check_shield_block(CHAR_DATA *ch, CHAR_DATA *victim, int dt)
{
	int cd_sk = 0;
	float chance;
	char buf1[MAX_STRING_LENGTH];
	char buf2[MAX_STRING_LENGTH];
	char *attack;

	if (get_eq_char(victim, WEAR_SHIELD) == nullptr)
		return false;

	if (!is_awake(victim))
		return false;

    chance = get_skill(victim, gsn_shield_block);
	if (chance < 2)
		return false;

	chance /= 4;
	chance += 15;

	cd_sk = get_skill(victim, gsn_champions_defense);

	if (cd_sk > 1)
	{
		if (number_percent() < (cd_sk * .85))
		{
			chance += 25;
			check_improve(victim, gsn_champions_defense, true, 5);
		}
		else
		{
			check_improve(victim, gsn_champions_defense, false, 5);
		}
	}

	/* posture */
	if (!is_npc(ch))
	{
		if (check_posture(ch) == POSTURE_DEFENSE && style_check(gsn_posture, ch->pcdata->style))
			chance += 20;
	}

	if (!is_npc(victim))
	{
		if (check_posture(victim) == POSTURE_DEFENSE && style_check(gsn_posture, victim->pcdata->style))
			chance += 10;

		if (check_posture(victim) == POSTURE_OFFENSE && style_check(gsn_posture, victim->pcdata->style))
			chance -= 20;
	}

	if (is_evil(victim) && (ch->level > victim->level) && is_affected(ch, gsn_awe))
		chance -= 20;

	if (is_npc(victim) || is_npc(ch))
		chance += (victim->level - ch->level);

	chance *= (float)((float)1 - ((float)get_hitroll(ch) / (float)250));
	chance -= victim->balance;
	chance += ch->balance;
	chance -= ch->batter;
	chance -= ch->analyze;

	if (victim->analyzePC == ch)
		chance += victim->analyze;

	if (check_entwine(victim, 1))
		chance /= 2;

	chance = std::min((float)55, chance);

	if (number_percent() >= chance)
		return false;

	attack = get_dam_message(ch, dt);

	sprintf(buf1, "You block $n's %s with your shield.", attack);
	sprintf(buf2, "$N blocks your %s with $S shield.", attack);

	if (IS_SET(victim->wiznet, WIZ_PERCENT))
		sprintf(buf1, "You block $n's %s with your shield. (%d%%)", attack, (int)chance);

	if (IS_SET(ch->wiznet, WIZ_PERCENT))
		sprintf(buf2, "$N blocks your %s with $S shield. (%d%%)", attack, (int)chance);

	act(buf1, ch, 0, victim, TO_VICT);
	act(buf2, ch, 0, victim, TO_CHAR);
	check_improve(victim, gsn_shield_block, true, 4);

	/* Barbarian batter check */

	if (!is_npc(ch))
	{
		if (style_check(gsn_batter, ch->pcdata->style))
			check_batter(ch);
	}
	else if (IS_SET(ch->progtypes, MPROG_FIGHT) && !str_cmp(ch->pIndexData->mprogs->fight_name, "fight_prog_barbarian"))
	{
		check_batter(ch);
	}

	return true;
}